

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O0

void __thiscall
AdaptorTest_QueueTest_Test::~AdaptorTest_QueueTest_Test(AdaptorTest_QueueTest_Test *this)

{
  void *in_RDI;
  
  ~AdaptorTest_QueueTest_Test((AdaptorTest_QueueTest_Test *)0x171af8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(AdaptorTest, QueueTest) {
    std::queue<int, Deque<int>> q;
    for (int i = 0; i < 100; ++i) {
        q.push(i);
    }

    for (int i = 0; i < 100; ++i) {
        ASSERT_FALSE(q.empty());
        ASSERT_EQ(q.front(), i);
        q.pop();
    }
}